

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::GenerateInstallRules(cmLocalGenerator *this)

{
  cmMakefile *pcVar1;
  pointer ppcVar2;
  cmInstallGenerator *this_00;
  pointer pbVar3;
  bool bVar4;
  PolicyStatus PVar5;
  char *pcVar6;
  string *psVar7;
  ostream *poVar8;
  PolicyID id;
  pointer this_01;
  string *configurationType;
  char **c;
  undefined8 *puVar9;
  pointer ppcVar10;
  bool haveInstallAfterSubdirectory;
  char local_4d3;
  bool haveSubdirectoryInstall;
  allocator<char> local_4d1;
  char *local_4d0;
  string odir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> children;
  string default_config;
  string local_450;
  string homedir;
  string file;
  ostringstream e;
  cmGeneratedFileStream fout;
  
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"CMAKE_INSTALL_PREFIX",(allocator<char> *)&e);
  pcVar6 = cmMakefile::GetDefinition(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  local_4d0 = "/usr/local";
  if (pcVar6 != (char *)0x0) {
    local_4d0 = pcVar6;
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"CMAKE_STAGING_PREFIX",(allocator<char> *)&e);
  pcVar6 = cmMakefile::GetDefinition(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  if (pcVar6 != (char *)0x0) {
    local_4d0 = pcVar6;
  }
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configurationTypes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_450,this->Makefile,&configurationTypes,false);
  std::__cxx11::string::string((string *)&default_config,(string *)&local_450);
  puVar9 = &DAT_005bacf0;
  while ((pbVar3 = configurationTypes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, pcVar6 = (char *)*puVar9,
         pcVar6 != (char *)0x0 &&
         (psVar7 = configurationTypes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, default_config._M_string_length == 0))
        ) {
    for (; psVar7 != pbVar3; psVar7 = psVar7 + 1) {
      cmsys::SystemTools::UpperCase((string *)&fout,psVar7);
      bVar4 = std::operator==((string *)&fout,pcVar6);
      std::__cxx11::string::~string((string *)&fout);
      if (bVar4) {
        std::__cxx11::string::_M_assign((string *)&default_config);
      }
    }
    puVar9 = puVar9 + 1;
  }
  if ((default_config._M_string_length == 0) &&
     (configurationTypes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      configurationTypes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    std::__cxx11::string::_M_assign((string *)&default_config);
  }
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&fout,&this->StateSnapshot);
  pcVar6 = local_4d0;
  psVar7 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&fout);
  std::__cxx11::string::string((string *)&file,(string *)psVar7);
  psVar7 = cmState::GetBinaryDirectory_abi_cxx11_
                     ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  std::__cxx11::string::string((string *)&homedir,(string *)psVar7);
  local_4d3 = std::operator==(&file,&homedir);
  std::__cxx11::string::append((char *)&file);
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,&file,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
  poVar8 = std::operator<<((ostream *)&fout,"# Install script for directory: ");
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&e,&this->StateSnapshot);
  psVar7 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&e);
  poVar8 = std::operator<<(poVar8,(string *)psVar7);
  poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&fout,"# Set the install prefix");
  poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<(poVar8,"if(NOT DEFINED CMAKE_INSTALL_PREFIX)");
  poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<(poVar8,"  set(CMAKE_INSTALL_PREFIX \"");
  poVar8 = std::operator<<(poVar8,pcVar6);
  poVar8 = std::operator<<(poVar8,"\")");
  poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<(poVar8,"endif()");
  poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<(poVar8,"string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX ");
  poVar8 = std::operator<<(poVar8,"\"${CMAKE_INSTALL_PREFIX}\")");
  poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&fout,
                           "# Set the install configuration name.\nif(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n  if(BUILD_TYPE)\n    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n  else()\n    set(CMAKE_INSTALL_CONFIG_NAME \""
                          );
  poVar8 = std::operator<<(poVar8,(string *)&default_config);
  std::operator<<(poVar8,
                  "\")\n  endif()\n  message(STATUS \"Install configuration: \\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\nendif()\n\n"
                 );
  std::operator<<((ostream *)&fout,
                  "# Set the component getting installed.\nif(NOT CMAKE_INSTALL_COMPONENT)\n  if(COMPONENT)\n    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n  else()\n    set(CMAKE_INSTALL_COMPONENT)\n  endif()\nendif()\n\n"
                 );
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_INSTALL_SO_NO_EXE",(allocator<char> *)&odir);
  pcVar6 = cmMakefile::GetDefinition(pcVar1,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (pcVar6 != (char *)0x0) {
    poVar8 = std::operator<<((ostream *)&fout,
                             "# Install shared libraries without execute permission?\nif(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n  set(CMAKE_INSTALL_SO_NO_EXE \""
                            );
    poVar8 = std::operator<<(poVar8,pcVar6);
    std::operator<<(poVar8,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_CROSSCOMPILING",(allocator<char> *)&odir);
  pcVar6 = cmMakefile::GetDefinition(pcVar1,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (pcVar6 != (char *)0x0) {
    poVar8 = std::operator<<((ostream *)&fout,
                             "# Is this installation the result of a crosscompile?\nif(NOT DEFINED CMAKE_CROSSCOMPILING)\n  set(CMAKE_CROSSCOMPILING \""
                            );
    poVar8 = std::operator<<(poVar8,pcVar6);
    std::operator<<(poVar8,"\")\nendif()\n\n");
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",(allocator<char> *)&odir);
  pcVar6 = cmMakefile::GetDefinition(pcVar1,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (pcVar6 != (char *)0x0) {
    poVar8 = std::operator<<((ostream *)&fout,
                             "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS)\n  set(CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS \""
                            );
    poVar8 = std::operator<<(poVar8,pcVar6);
    std::operator<<(poVar8,"\")\nendif()\n\n");
  }
  PVar5 = GetPolicyStatus(this,CMP0082);
  haveSubdirectoryInstall = false;
  haveInstallAfterSubdirectory = false;
  ppcVar10 = (this->Makefile->InstallGenerators).
             super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppcVar2 = (this->Makefile->InstallGenerators).
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_4d0 = (char *)CONCAT44(local_4d0._4_4_,PVar5);
  if (PVar5 == WARN) {
    for (; ppcVar10 != ppcVar2; ppcVar10 = ppcVar10 + 1) {
      this_00 = *ppcVar10;
      (*(this_00->super_cmScriptGenerator)._vptr_cmScriptGenerator[9])
                (this_00,&haveSubdirectoryInstall,&haveInstallAfterSubdirectory);
      cmScriptGenerator::Generate
                (&this_00->super_cmScriptGenerator,(ostream *)&fout,&local_450,&configurationTypes);
    }
  }
  else {
    for (; ppcVar10 != ppcVar2; ppcVar10 = ppcVar10 + 1) {
      cmScriptGenerator::Generate
                (&(*ppcVar10)->super_cmScriptGenerator,(ostream *)&fout,&local_450,
                 &configurationTypes);
    }
  }
  GenerateTargetInstallRules(this,(ostream *)&fout,&local_450,&configurationTypes);
  if ((int)local_4d0 != 0) {
    if ((int)local_4d0 != 1) goto LAB_001558cc;
    if (haveInstallAfterSubdirectory == true) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"CMAKE_POLICY_WARNING_CMP0082",(allocator<char> *)&odir);
      bVar4 = cmMakefile::PolicyOptionalWarningEnabled(pcVar1,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&odir,(cmPolicies *)0x52,id);
        poVar8 = std::operator<<((ostream *)&e,(string *)&odir);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&odir);
        std::__cxx11::stringbuf::str();
        IssueMessage(this,AUTHOR_WARNING,&odir);
        std::__cxx11::string::~string((string *)&odir);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
    }
  }
  cmMakefile::GetStateSnapshot(this->Makefile);
  cmStateSnapshot::GetChildren(&children,(cmStateSnapshot *)&e);
  if (children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start !=
      children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::operator<<((ostream *)&fout,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n");
    std::operator<<((ostream *)&fout,"  # Include the install script for each subdirectory.\n");
    for (this_01 = children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        this_01 !=
        children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
        super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&e,this_01);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&odir,"EXCLUDE_FROM_ALL",&local_4d1);
      bVar4 = cmStateDirectory::GetPropertyAsBool((cmStateDirectory *)&e,&odir);
      std::__cxx11::string::~string((string *)&odir);
      if (!bVar4) {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)&e,this_01);
        psVar7 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&e);
        std::__cxx11::string::string((string *)&odir,(string *)psVar7);
        cmsys::SystemTools::ConvertToUnixSlashes(&odir);
        poVar8 = std::operator<<((ostream *)&fout,"  include(\"");
        poVar8 = std::operator<<(poVar8,(string *)&odir);
        poVar8 = std::operator<<(poVar8,"/cmake_install.cmake\")");
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::string::~string((string *)&odir);
      }
    }
    std::operator<<((ostream *)&fout,"\n");
    std::operator<<((ostream *)&fout,"endif()\n\n");
  }
  std::_Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~_Vector_base
            (&children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>);
LAB_001558cc:
  if (local_4d3 != '\0') {
    poVar8 = std::operator<<((ostream *)&fout,
                             "if(CMAKE_INSTALL_COMPONENT)\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest_${CMAKE_INSTALL_COMPONENT}.txt\")\nelse()\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\nendif()\n\nstring(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\nfile(WRITE \""
                            );
    poVar8 = std::operator<<(poVar8,(string *)&homedir);
    std::operator<<(poVar8,
                    "/${CMAKE_INSTALL_MANIFEST}\"\n     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  std::__cxx11::string::~string((string *)&homedir);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&default_config);
  std::__cxx11::string::~string((string *)&local_450);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configurationTypes);
  return;
}

Assistant:

void cmLocalGenerator::GenerateInstallRules()
{
  // Compute the install prefix.
  const char* prefix = this->Makefile->GetDefinition("CMAKE_INSTALL_PREFIX");

#if defined(_WIN32) && !defined(__CYGWIN__)
  std::string prefix_win32;
  if (!prefix) {
    if (!cmSystemTools::GetEnv("SystemDrive", prefix_win32)) {
      prefix_win32 = "C:";
    }
    const char* project_name = this->Makefile->GetDefinition("PROJECT_NAME");
    if (project_name && project_name[0]) {
      prefix_win32 += "/Program Files/";
      prefix_win32 += project_name;
    } else {
      prefix_win32 += "/InstalledCMakeProject";
    }
    prefix = prefix_win32.c_str();
  }
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (!prefix) {
    if (find_directory(B_SYSTEM_DIRECTORY, -1, false, dir, sizeof(dir)) ==
        B_OK) {
      prefix = dir;
    } else {
      prefix = "/boot/system";
    }
  }
#else
  if (!prefix) {
    prefix = "/usr/local";
  }
#endif
  if (const char* stagingPrefix =
        this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX")) {
    prefix = stagingPrefix;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  // Choose a default install configuration.
  std::string default_config = config;
  const char* default_order[] = { "RELEASE", "MINSIZEREL", "RELWITHDEBINFO",
                                  "DEBUG", nullptr };
  for (const char** c = default_order; *c && default_config.empty(); ++c) {
    for (std::string const& configurationType : configurationTypes) {
      if (cmSystemTools::UpperCase(configurationType) == *c) {
        default_config = configurationType;
      }
    }
  }
  if (default_config.empty() && !configurationTypes.empty()) {
    default_config = configurationTypes[0];
  }

  // Create the install script file.
  std::string file = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  std::string homedir = this->GetState()->GetBinaryDirectory();
  int toplevel_install = 0;
  if (file == homedir) {
    toplevel_install = 1;
  }
  file += "/cmake_install.cmake";
  cmGeneratedFileStream fout(file);
  fout.SetCopyIfDifferent(true);

  // Write the header.
  fout << "# Install script for directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource() << std::endl
       << std::endl;
  fout << "# Set the install prefix" << std::endl
       << "if(NOT DEFINED CMAKE_INSTALL_PREFIX)" << std::endl
       << "  set(CMAKE_INSTALL_PREFIX \"" << prefix << "\")" << std::endl
       << "endif()" << std::endl
       << R"(string(REGEX REPLACE "/$" "" CMAKE_INSTALL_PREFIX )"
       << "\"${CMAKE_INSTALL_PREFIX}\")" << std::endl
       << std::endl;

  // Write support code for generating per-configuration install rules.
  /* clang-format off */
  fout <<
    "# Set the install configuration name.\n"
    "if(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n"
    "  if(BUILD_TYPE)\n"
    "    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n"
    "           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_CONFIG_NAME \"" << default_config << "\")\n"
    "  endif()\n"
    "  message(STATUS \"Install configuration: "
    "\\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\n"
    "endif()\n"
    "\n";
  /* clang-format on */

  // Write support code for dealing with component-specific installs.
  /* clang-format off */
  fout <<
    "# Set the component getting installed.\n"
    "if(NOT CMAKE_INSTALL_COMPONENT)\n"
    "  if(COMPONENT)\n"
    "    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n"
    "    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_COMPONENT)\n"
    "  endif()\n"
    "endif()\n"
    "\n";
  /* clang-format on */

  // Copy user-specified install options to the install code.
  if (const char* so_no_exe =
        this->Makefile->GetDefinition("CMAKE_INSTALL_SO_NO_EXE")) {
    /* clang-format off */
    fout <<
      "# Install shared libraries without execute permission?\n"
      "if(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n"
      "  set(CMAKE_INSTALL_SO_NO_EXE \"" << so_no_exe << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Copy cmake cross compile state to install code.
  if (const char* crosscompiling =
        this->Makefile->GetDefinition("CMAKE_CROSSCOMPILING")) {
    /* clang-format off */
    fout <<
      "# Is this installation the result of a crosscompile?\n"
      "if(NOT DEFINED CMAKE_CROSSCOMPILING)\n"
      "  set(CMAKE_CROSSCOMPILING \"" << crosscompiling << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write default directory permissions.
  if (const char* defaultDirPermissions = this->Makefile->GetDefinition(
        "CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS)\n"
      "  set(CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS \""
         << defaultDirPermissions << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Ask each install generator to write its code.
  cmPolicies::PolicyStatus status = this->GetPolicyStatus(cmPolicies::CMP0082);
  std::vector<cmInstallGenerator*> const& installers =
    this->Makefile->GetInstallGenerators();
  bool haveSubdirectoryInstall = false;
  bool haveInstallAfterSubdirectory = false;
  if (status == cmPolicies::WARN) {
    for (cmInstallGenerator* installer : installers) {
      installer->CheckCMP0082(haveSubdirectoryInstall,
                              haveInstallAfterSubdirectory);
      installer->Generate(fout, config, configurationTypes);
    }
  } else {
    for (cmInstallGenerator* installer : installers) {
      installer->Generate(fout, config, configurationTypes);
    }
  }

  // Write rules from old-style specification stored in targets.
  this->GenerateTargetInstallRules(fout, config, configurationTypes);

  // Include install scripts from subdirectories.
  switch (status) {
    case cmPolicies::WARN:
      if (haveInstallAfterSubdirectory &&
          this->Makefile->PolicyOptionalWarningEnabled(
            "CMAKE_POLICY_WARNING_CMP0082")) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0082) << "\n";
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD: {
      std::vector<cmStateSnapshot> children =
        this->Makefile->GetStateSnapshot().GetChildren();
      if (!children.empty()) {
        fout << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n";
        fout << "  # Include the install script for each subdirectory.\n";
        for (cmStateSnapshot const& c : children) {
          if (!c.GetDirectory().GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
            std::string odir = c.GetDirectory().GetCurrentBinary();
            cmSystemTools::ConvertToUnixSlashes(odir);
            fout << "  include(\"" << odir << "/cmake_install.cmake\")"
                 << std::endl;
          }
        }
        fout << "\n";
        fout << "endif()\n\n";
      }
    } break;

    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // NEW behavior is handled in
      // cmInstallSubdirectoryGenerator::GenerateScript()
      break;
  }

  // Record the install manifest.
  if (toplevel_install) {
    /* clang-format off */
    fout <<
      "if(CMAKE_INSTALL_COMPONENT)\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest_"
      "${CMAKE_INSTALL_COMPONENT}.txt\")\n"
      "else()\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\n"
      "endif()\n"
      "\n"
      "string(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n"
      "       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\n"
      "file(WRITE \"" << homedir << "/${CMAKE_INSTALL_MANIFEST}\"\n"
      "     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n";
    /* clang-format on */
  }
}